

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readCustomSection(WasmBinaryReader *this,size_t payloadLen)

{
  Module *pMVar1;
  pointer pCVar2;
  char *pcVar3;
  undefined *puVar4;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  string_view other;
  string_view other_00;
  string_view other_01;
  string_view other_02;
  string_view sVar9;
  string local_70;
  vector<char,std::allocator<char>> local_50 [24];
  undefined1 local_38 [8];
  Name sectionName;
  
  sVar8 = this->pos;
  _local_38 = (string_view)getInlineString(this,true);
  pcVar3 = BinaryConsts::CustomSections::Name;
  uVar6 = this->pos - sVar8;
  sVar8 = payloadLen - uVar6;
  if (uVar6 <= payloadLen) {
    sVar7 = strlen(BinaryConsts::CustomSections::Name);
    sVar9._M_str = pcVar3;
    sVar9._M_len = sVar7;
    bVar5 = IString::equals((IString *)local_38,sVar9);
    puVar4 = BinaryConsts::CustomSections::TargetFeatures;
    if (bVar5) {
      this->pos = this->pos + sVar8;
    }
    else {
      sVar7 = strlen(BinaryConsts::CustomSections::TargetFeatures);
      other._M_str = puVar4;
      other._M_len = sVar7;
      bVar5 = IString::equals((IString *)local_38,other);
      puVar4 = BinaryConsts::CustomSections::Dylink;
      if (bVar5) {
        readFeatures(this,sVar8);
      }
      else {
        sVar7 = strlen(BinaryConsts::CustomSections::Dylink);
        other_00._M_str = puVar4;
        other_00._M_len = sVar7;
        bVar5 = IString::equals((IString *)local_38,other_00);
        puVar4 = BinaryConsts::CustomSections::Dylink0;
        if (bVar5) {
          readDylink(this,sVar8);
        }
        else {
          sVar7 = strlen(BinaryConsts::CustomSections::Dylink0);
          other_01._M_str = puVar4;
          other_01._M_len = sVar7;
          bVar5 = IString::equals((IString *)local_38,other_01);
          puVar4 = BinaryConsts::CustomSections::Linking;
          if (bVar5) {
            readDylink0(this,sVar8);
          }
          else {
            sVar7 = strlen(BinaryConsts::CustomSections::Linking);
            other_02._M_str = puVar4;
            other_02._M_len = sVar7;
            bVar5 = IString::equals((IString *)local_38,other_02);
            if (bVar5) {
              std::operator<<((ostream *)&std::cerr,
                              "warning: linking section is present, so this is not a standard wasm file - binaryen cannot handle this properly!\n"
                             );
            }
            pMVar1 = this->wasm;
            std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::resize
                      (&pMVar1->customSections,
                       ((long)(pMVar1->customSections).
                              super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pMVar1->customSections).
                             super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x38 + 1);
            pCVar2 = (this->wasm->customSections).
                     super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)(pCVar2 + -1),
                       (basic_string_view<char,_std::char_traits<char>_> *)local_38);
            sVar9 = getByteView(this,sVar8);
            std::vector<char,std::allocator<char>>::vector<char_const*,void>
                      (local_50,sVar9._M_str,sVar9._M_str + sVar9._M_len,
                       (allocator_type *)((long)&sectionName.super_IString.str._M_str + 7));
            std::vector<char,_std::allocator<char>_>::_M_move_assign(&pCVar2[-1].data,local_50);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      ((_Vector_base<char,_std::allocator<char>_> *)local_50);
          }
        }
      }
    }
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"bad user section size",(allocator<char> *)local_50);
  throwError(this,&local_70);
}

Assistant:

void WasmBinaryReader::readCustomSection(size_t payloadLen) {
  auto oldPos = pos;
  Name sectionName = getInlineString();
  size_t read = pos - oldPos;
  if (read > payloadLen) {
    throwError("bad user section size");
  }
  payloadLen -= read;
  if (sectionName.equals(BinaryConsts::CustomSections::Name)) {
    // We already read the name section before anything else.
    pos += payloadLen;
  } else if (sectionName.equals(BinaryConsts::CustomSections::TargetFeatures)) {
    readFeatures(payloadLen);
  } else if (sectionName.equals(BinaryConsts::CustomSections::Dylink)) {
    readDylink(payloadLen);
  } else if (sectionName.equals(BinaryConsts::CustomSections::Dylink0)) {
    readDylink0(payloadLen);
  } else {
    // an unfamiliar custom section
    if (sectionName.equals(BinaryConsts::CustomSections::Linking)) {
      std::cerr
        << "warning: linking section is present, so this is not a standard "
           "wasm file - binaryen cannot handle this properly!\n";
    }
    wasm.customSections.resize(wasm.customSections.size() + 1);
    auto& section = wasm.customSections.back();
    section.name = sectionName.str;
    auto data = getByteView(payloadLen);
    section.data = {data.begin(), data.end()};
  }
}